

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O2

void __thiscall customUnits_uniqueness_Test::TestBody(customUnits_uniqueness_Test *this)

{
  bool bVar1;
  int iVar2;
  uint16_t code;
  char *pcVar3;
  char *in_R9;
  ushort local_aa;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  precise_unit cunit2;
  AssertHelper local_58;
  precise_unit cunit1;
  precise_unit cunit1inv;
  
  for (local_aa = 0; local_aa < 0x400; local_aa = local_aa + 1) {
    cunit1 = units::precise::generate_custom_unit(local_aa);
    cunit1inv = units::precise_unit::inv(&cunit1);
    gtest_ar_._0_4_ = cunit1.base_units_;
    iVar2 = units::precise::custom::custom_unit_number((unit_data *)&gtest_ar_);
    cunit2.multiplier_._0_4_ = iVar2;
    testing::internal::CmpHelperEQ<int,unsigned_short>
              ((internal *)&gtest_ar,"precise::custom::custom_unit_number(cunit1.base_units())","ii"
               ,(int *)&cunit2,&local_aa);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&cunit2);
      pcVar3 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,900,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&cunit2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      if (cunit2.multiplier_ != 0.0) {
        (**(code **)(*(long *)cunit2.multiplier_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar_._0_4_ = cunit1.base_units_;
    iVar2 = units::precise::custom::custom_unit_number((unit_data *)&gtest_ar_);
    cunit2.multiplier_._0_4_ = iVar2;
    testing::internal::CmpHelperEQ<int,unsigned_short>
              ((internal *)&gtest_ar,"precise::custom::custom_unit_number(cunit1.base_units())","ii"
               ,(int *)&cunit2,&local_aa);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&cunit2);
      pcVar3 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x385,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&cunit2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      if (cunit2.multiplier_ != 0.0) {
        (**(code **)(*(long *)cunit2.multiplier_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    for (code = 0; code != 0x400; code = code + 1) {
      if (code != local_aa) {
        cunit2 = units::precise::generate_custom_unit(code);
        bVar1 = units::precise_unit::operator==(&cunit1,&cunit2);
        bVar1 = !bVar1;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = bVar1;
        if (!bVar1) {
          testing::Message::Message((Message *)&local_a8);
          std::operator<<((ostream *)(local_a8._M_head_impl + 0x10),
                          "Error with false comparison 1 index ");
          std::ostream::operator<<(local_a8._M_head_impl + 0x10,local_aa);
          std::operator<<((ostream *)(local_a8._M_head_impl + 0x10),",");
          std::ostream::operator<<(local_a8._M_head_impl + 0x10,code);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"cunit1 == cunit2","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x38b,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if (local_a8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_a8._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        gtest_ar = (AssertionResult)units::precise_unit::inv(&cunit2);
        bVar1 = units::precise_unit::operator==(&cunit1,(precise_unit *)&gtest_ar);
        gtest_ar_.success_ = !bVar1;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_a8);
          std::operator<<((ostream *)(local_a8._M_head_impl + 0x10),
                          "Error with false comparison 1 inv index ");
          std::ostream::operator<<(local_a8._M_head_impl + 0x10,local_aa);
          std::operator<<((ostream *)(local_a8._M_head_impl + 0x10),",");
          std::ostream::operator<<(local_a8._M_head_impl + 0x10,code);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"cunit1 == cunit2.inv()","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x38d,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if (local_a8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_a8._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        bVar1 = units::precise_unit::operator==(&cunit1inv,&cunit2);
        gtest_ar_.success_ = !bVar1;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_a8);
          std::operator<<((ostream *)(local_a8._M_head_impl + 0x10),
                          "Error with false inv comparison 2 index ");
          std::ostream::operator<<(local_a8._M_head_impl + 0x10,local_aa);
          std::operator<<((ostream *)(local_a8._M_head_impl + 0x10),",");
          std::ostream::operator<<(local_a8._M_head_impl + 0x10,code);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"cunit1inv == cunit2","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x390,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if (local_a8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_a8._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        gtest_ar = (AssertionResult)units::precise_unit::inv(&cunit2);
        bVar1 = units::precise_unit::operator==(&cunit1inv,(precise_unit *)&gtest_ar);
        gtest_ar_.success_ = !bVar1;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (bVar1) {
          testing::Message::Message((Message *)&local_a8);
          std::operator<<((ostream *)(local_a8._M_head_impl + 0x10),
                          "Error with false inv comparison 2 inv index ");
          std::ostream::operator<<(local_a8._M_head_impl + 0x10,local_aa);
          std::operator<<((ostream *)(local_a8._M_head_impl + 0x10),",");
          std::ostream::operator<<(local_a8._M_head_impl + 0x10,code);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"cunit1inv == cunit2.inv()","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x393,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if (local_a8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_a8._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
      }
    }
  }
  return;
}

Assistant:

TEST(customUnits, uniqueness)
{
    for (std::uint16_t ii = 0; ii < 1024; ++ii) {
        auto cunit1 = precise::generate_custom_unit(ii);
        auto cunit1inv = cunit1.inv();

        EXPECT_EQ(precise::custom::custom_unit_number(cunit1.base_units()), ii);
        EXPECT_EQ(precise::custom::custom_unit_number(cunit1.base_units()), ii);
        for (std::uint16_t jj = 0; jj < 1024; ++jj) {
            if (ii == jj) {
                continue;
            }
            auto cunit2 = precise::generate_custom_unit(jj);
            EXPECT_FALSE(cunit1 == cunit2)
                << "Error with false comparison 1 index " << ii << "," << jj;
            EXPECT_FALSE(cunit1 == cunit2.inv())
                << "Error with false comparison 1 inv index " << ii << ","
                << jj;
            EXPECT_FALSE(cunit1inv == cunit2)
                << "Error with false inv comparison 2 index " << ii << ","
                << jj;
            EXPECT_FALSE(cunit1inv == cunit2.inv())
                << "Error with false inv comparison 2 inv index " << ii << ","
                << jj;
        }
    }
}